

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

AActor * P_RoughMonsterSearch(AActor *mo,int distance,bool onlyseekable,bool frontonly)

{
  AActor *pAVar1;
  double dVar2;
  undefined1 local_40;
  undefined1 local_3f;
  BlockCheckInfo info;
  bool frontonly_local;
  bool onlyseekable_local;
  int distance_local;
  AActor *mo_local;
  
  local_40 = onlyseekable;
  local_3f = frontonly;
  info.frontline.dy._2_1_ = frontonly;
  info.frontline.dy._3_1_ = onlyseekable;
  info.frontline.dy._4_4_ = distance;
  if (frontonly) {
    info._0_8_ = AActor::X(mo);
    info.frontline.x = AActor::Y(mo);
    dVar2 = TAngle<double>::Sin(&(mo->Angles).Yaw);
    info.frontline.y = -dVar2;
    dVar2 = TAngle<double>::Cos(&(mo->Angles).Yaw);
    info.frontline.dx = -dVar2;
  }
  pAVar1 = P_BlockmapSearch(mo,info.frontline.dy._4_4_,RoughBlockCheck,&local_40);
  return pAVar1;
}

Assistant:

AActor *P_RoughMonsterSearch(AActor *mo, int distance, bool onlyseekable, bool frontonly)
{
	BlockCheckInfo info;
	info.onlyseekable = onlyseekable;
	if ((info.frontonly = frontonly))
	{
		info.frontline.x = mo->X();
		info.frontline.y = mo->Y();
		info.frontline.dx = -mo->Angles.Yaw.Sin();
		info.frontline.dy = -mo->Angles.Yaw.Cos();
	}

	return P_BlockmapSearch(mo, distance, RoughBlockCheck, (void *)&info);
}